

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

float * GPU_GetCurrentMatrix(void)

{
  GPU_Target *pGVar1;
  GPU_MatrixStack *local_20;
  GPU_MatrixStack *stack;
  GPU_Target *target;
  
  pGVar1 = GPU_GetContextTarget();
  if ((pGVar1 == (GPU_Target *)0x0) || (pGVar1->context == (GPU_Context *)0x0)) {
    target = (GPU_Target *)0x0;
  }
  else {
    if (pGVar1->context->matrix_mode == 0) {
      local_20 = &pGVar1->context->modelview_matrix;
    }
    else {
      local_20 = &pGVar1->context->projection_matrix;
    }
    if (local_20->size == 0) {
      target = (GPU_Target *)0x0;
    }
    else {
      target = (GPU_Target *)local_20->matrix[local_20->size - 1];
    }
  }
  return (float *)target;
}

Assistant:

float* GPU_GetCurrentMatrix(void)
{
    GPU_Target* target = GPU_GetContextTarget();
    GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return NULL;
    if(target->context->matrix_mode == GPU_MODELVIEW)
        stack = &target->context->modelview_matrix;
    else
        stack = &target->context->projection_matrix;
    
    if(stack->size == 0)
        return NULL;
    return stack->matrix[stack->size-1];
}